

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_1b21075::PeerManagerImpl::SetupAddressRelay
          (PeerManagerImpl *this,CNode *node,Peer *peer)

{
  long lVar1;
  bool bVar2;
  unique_ptr<CRollingBloomFilter,_std::default_delete<CRollingBloomFilter>_> *in_RDX;
  unique_ptr<CRollingBloomFilter,_std::default_delete<CRollingBloomFilter>_> *in_RSI;
  atomic<bool> *in_RDI;
  long in_FS_OFFSET;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  undefined1 local_21;
  undefined4 in_stack_ffffffffffffffe8;
  int *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = CNode::IsBlockOnlyConn
                    ((CNode *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  if (bVar2) {
    local_21 = false;
  }
  else {
    bVar2 = std::atomic<bool>::exchange(in_RDI,SUB81((ulong)in_RSI >> 0x38,0),(memory_order)in_RSI);
    if (!bVar2) {
      std::make_unique<CRollingBloomFilter,int,double>
                (in_stack_fffffffffffffff0,(double *)CONCAT44(5000,in_stack_ffffffffffffffe8));
      std::unique_ptr<CRollingBloomFilter,_std::default_delete<CRollingBloomFilter>_>::operator=
                (in_RSI,in_RDX);
      std::unique_ptr<CRollingBloomFilter,_std::default_delete<CRollingBloomFilter>_>::~unique_ptr
                (in_RSI);
    }
    local_21 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_21;
  }
  __stack_chk_fail();
}

Assistant:

bool PeerManagerImpl::SetupAddressRelay(const CNode& node, Peer& peer)
{
    // We don't participate in addr relay with outbound block-relay-only
    // connections to prevent providing adversaries with the additional
    // information of addr traffic to infer the link.
    if (node.IsBlockOnlyConn()) return false;

    if (!peer.m_addr_relay_enabled.exchange(true)) {
        // During version message processing (non-block-relay-only outbound peers)
        // or on first addr-related message we have received (inbound peers), initialize
        // m_addr_known.
        peer.m_addr_known = std::make_unique<CRollingBloomFilter>(5000, 0.001);
    }

    return true;
}